

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator::GenerateFieldInfo
          (ImmutableEnumFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  string_view terminating_string;
  bool bVar1;
  uint32_t number;
  string_view text;
  string_view var_name;
  
  WriteUInt32ToUtf16CharSequence(this->descriptor_->number_,output);
  number = GetExperimentalJavaFieldType(this->descriptor_);
  WriteUInt32ToUtf16CharSequence(number,output);
  bVar1 = HasHasbit(this->descriptor_);
  if (bVar1) {
    WriteUInt32ToUtf16CharSequence(this->messageBitIndex_,output);
  }
  text._M_str = "\"$name$_\",\n";
  text._M_len = 0xb;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text);
  bVar1 = SupportUnknownEnumValue(this->descriptor_);
  if (!bVar1) {
    terminating_string._M_str = ",\n";
    terminating_string._M_len = 2;
    var_name._M_str = "$type$";
    var_name._M_len = 6;
    PrintEnumVerifierLogic
              (printer,this->descriptor_,&this->variables_,var_name,terminating_string,
               (this->context_->options_).enforce_lite);
  }
  return;
}

Assistant:

void ImmutableEnumFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  if (HasHasbit(descriptor_)) {
    WriteIntToUtf16CharSequence(messageBitIndex_, output);
  }
  printer->Print(variables_, "\"$name$_\",\n");
  if (!SupportUnknownEnumValue((descriptor_))) {
    PrintEnumVerifierLogic(printer, descriptor_, variables_,
                           /*var_name=*/"$type$",
                           /*terminating_string=*/",\n",
                           /*enforce_lite=*/context_->EnforceLite());
  }
}